

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirArchive.cpp
# Opt level: O3

void __thiscall gtar::DirArchive::DirArchive(DirArchive *this,string *filename,OpenMode mode)

{
  string *psVar1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  int iVar4;
  runtime_error *this_00;
  string stripped;
  stat dirStat;
  long *local_288 [2];
  long local_278 [2];
  string local_268 [32];
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [23];
  stat local_c0;
  
  (this->super_Archive)._vptr_Archive = (_func_int **)&PTR__DirArchive_001cdd30;
  psVar1 = &this->m_filename;
  (this->m_filename)._M_dataplus._M_p = (pointer)&(this->m_filename).field_2;
  pcVar3 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar1,pcVar3,pcVar3 + filename->_M_string_length);
  this->m_mode = mode;
  p_Var2 = &(this->m_createdDirectories)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->m_createdDirectories)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_createdDirectories)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_createdDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_createdDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_createdDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_createdDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_fileNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fileNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fileNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (mode != Read) {
    iVar4 = stat((filename->_M_dataplus)._M_p,&local_c0);
    if (iVar4 == 0) {
      if ((local_c0.st_mode._1_1_ & 0x40) == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_248);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_248 + 0x10),
                   "Error opening directory for write (file already exists)",0x37);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this_00,local_268);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      pcVar3 = (this->m_filename)._M_dataplus._M_p;
      local_288[0] = local_278;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_288,pcVar3,pcVar3 + (this->m_filename)._M_string_length);
      mkdir((char *)local_288[0],0x1ed);
      if (local_288[0] != local_278) {
        operator_delete(local_288[0],local_278[0] + 1);
      }
    }
  }
  std::__cxx11::string::find_last_not_of((char)psVar1,0x2f);
  std::__cxx11::string::substr((ulong)local_248,(ulong)psVar1);
  searchDirectory(this,(string *)local_248);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_,local_238[0]._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

DirArchive::DirArchive(const string &filename, const OpenMode mode):
        m_filename(filename), m_mode(mode), m_createdDirectories()
    {
        // make sure that the base directory exists
        if(m_mode != Read)
        {
            struct stat dirStat;
            const int result(stat(filename.c_str(), &dirStat));
            if(result == 0) // found that name
            {
                // not a directory
                if(!(dirStat.st_mode & S_IFDIR))
                {
                    stringstream msg;
                    msg << "Error opening directory for write (file already exists)";
                    throw runtime_error(msg.str());
                }
            }
            else
                createDirectory(m_filename);
        }

        // populate the list of found file names. first, strip all
        // trailing slashes; this will never return npos because the
        // directory always has at least one slash
        const size_t stripLength(m_filename.find_last_not_of('/') + 1);
        const string stripped(m_filename.substr(0, stripLength));
        searchDirectory(stripped);
    }